

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_iquot(LispPTR tosm1,LispPTR tos)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  LispPTR LVar8;
  
  uVar1 = (ulong)tos;
  uVar2 = (ulong)tosm1;
  if ((tosm1 & 0xfff0000) != 0xf0000) {
    if ((tosm1 & 0xfff0000) == 0xe0000) {
      uVar7 = tosm1 & 0xffff;
      goto LAB_001087f6;
    }
    uVar3 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 3) {
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      if (*(float *)(Lisp_world + uVar2) == 2.1474836e+09) {
        uVar7 = (uint)*(float *)(Lisp_world + uVar2);
        goto LAB_001087f6;
      }
    }
    else if (uVar3 == 2) {
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      uVar7 = *(uint *)(Lisp_world + uVar2);
      goto LAB_001087f6;
    }
    goto LAB_001088cd;
  }
  uVar7 = tosm1 | 0xffff0000;
LAB_001087f6:
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar6 = tos | 0xffff0000;
LAB_001088ad:
    uVar4 = (uint)((long)(int)uVar7 / (long)(int)uVar6);
    if ((uVar4 & 0xffff0000) == 0xffff0000) {
      LVar8 = uVar4 & 0xffff | 0xf0000;
    }
    else if (((long)(int)uVar7 / (long)(int)uVar6 & 0xffff0000U) == 0) {
      LVar8 = uVar4 | 0xe0000;
    }
    else {
      puVar5 = (uint *)createcell68k(2);
      *puVar5 = uVar4;
      if (((ulong)puVar5 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar5);
      }
      LVar8 = (LispPTR)((ulong)((long)puVar5 - (long)Lisp_world) >> 1);
    }
  }
  else {
    if ((tos & 0xfff0000) == 0xe0000) {
      uVar6 = tos & 0xffff;
LAB_001088a9:
      if (uVar6 != 0) goto LAB_001088ad;
    }
    else {
      uVar3 = *(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar3 == 3) {
        if ((tos & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        if (*(float *)(Lisp_world + uVar1) == 2.1474836e+09) {
          uVar6 = (uint)*(float *)(Lisp_world + uVar1);
          goto LAB_001088a9;
        }
      }
      else if (uVar3 == 2) {
        if ((tos & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
        }
        uVar6 = *(uint *)(Lisp_world + uVar1);
        goto LAB_001088a9;
      }
    }
LAB_001088cd:
    MachineState.errorexit = 1;
    LVar8 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return LVar8;
}

Assistant:

LispPTR N_OP_iquot(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn;

  result = arg1 / arg2;
  N_ARITH_SWITCH(result);

doufn:
  ERROR_EXIT(tos);

}